

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O0

basic_bigint<std::allocator<unsigned_char>_> *
jsoncons::basic_bigint<std::allocator<unsigned_char>_>::from_string<wchar_t>
          (wchar_t *data,size_type length)

{
  runtime_error *this;
  ulong in_RDX;
  int *in_RSI;
  basic_bigint<std::allocator<unsigned_char>_> *in_RDI;
  wchar_t c;
  size_type i;
  bool neg;
  basic_bigint<std::allocator<unsigned_char>_> *v;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_bigint<std::allocator<unsigned_char>_> *x;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  _Alloc_hider in_stack_fffffffffffffec7;
  allocator<char> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  int64_t in_stack_fffffffffffffef0;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffef8;
  string local_d8 [172];
  int local_2c;
  ulong local_28;
  undefined1 local_1a;
  byte local_19;
  ulong local_18;
  int *local_10;
  
  local_19 = *in_RSI == 0x2d;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((bool)local_19) {
    local_10 = in_RSI + 1;
    local_18 = in_RDX - 1;
  }
  local_1a = 0;
  x = in_RDI;
  basic_bigint<int>((basic_bigint<std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffffec7,
                             CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                    (int)((ulong)in_RDI >> 0x20),in_RDI);
  local_28 = 0;
  while( true ) {
    if (local_18 <= local_28) {
      if ((local_19 & 1) != 0) {
        *(byte *)&in_RDI->field_0 = *(byte *)&in_RDI->field_0 & 0xfd | 2;
      }
      return x;
    }
    local_2c = local_10[local_28];
    if (9 < local_2c - 0x30U) break;
    basic_bigint((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee0,
                 (basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8);
    jsoncons::operator*(x,(int64_t)in_RDI);
    jsoncons::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    operator=(in_RDI,in_stack_fffffffffffffea8);
    ~basic_bigint(in_stack_fffffffffffffea0);
    ~basic_bigint(in_stack_fffffffffffffea0);
    ~basic_bigint(in_stack_fffffffffffffea0);
    local_28 = local_28 + 1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xfffffffffffffec7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(__lhs,(char *)this);
  std::operator+(__lhs,(char)((ulong)this >> 0x38));
  std::operator+(__lhs,(char *)this);
  std::runtime_error::runtime_error(this,local_d8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static basic_bigint<Allocator> from_string(const CharT* data, size_type length)
    {
        bool neg;
        if (*data == '-')
        {
            neg = true;
            data++;
            --length;
        }
        else
        {
            neg = false;
        }

        basic_bigint<Allocator> v = 0;
        for (size_type i = 0; i < length; i++)
        {
            CharT c = data[i];
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    v = (v * 10u) + (uint64_t)(c - '0');
                    break;
                default:
                    JSONCONS_THROW(std::runtime_error(std::string("Invalid digit ") + "\'" + (char)c + "\'"));
            }
        }

        if (neg)
        {
            v.common_stor_.is_negative_ = true;
        }

        return v;
    }